

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O2

void Inta_ManResize(Inta_Man_t *p)

{
  int iVar1;
  lit *plVar2;
  char *pcVar3;
  int *piVar4;
  Sto_Cls_t **ppSVar5;
  Aig_Obj_t **__s;
  int iVar6;
  size_t sVar7;
  
  p->Counter = 0;
  iVar6 = p->nVarsAlloc;
  iVar1 = p->pCnf->nVars;
  if (iVar6 < iVar1) {
    if (iVar6 != 0) goto LAB_0070e8ad;
    iVar6 = 1;
    while( true ) {
      p->nVarsAlloc = iVar6;
LAB_0070e8ad:
      if (iVar1 <= iVar6) break;
      iVar6 = iVar6 * 2;
    }
    if (p->pTrail == (lit *)0x0) {
      plVar2 = (lit *)malloc((long)iVar6 << 2);
    }
    else {
      plVar2 = (lit *)realloc(p->pTrail,(long)iVar6 << 2);
    }
    p->pTrail = plVar2;
    sVar7 = (long)p->nVarsAlloc << 2;
    if (p->pAssigns == (lit *)0x0) {
      plVar2 = (lit *)malloc(sVar7);
    }
    else {
      plVar2 = (lit *)realloc(p->pAssigns,sVar7);
    }
    p->pAssigns = plVar2;
    if (p->pSeens == (char *)0x0) {
      pcVar3 = (char *)malloc((long)p->nVarsAlloc);
    }
    else {
      pcVar3 = (char *)realloc(p->pSeens,(long)p->nVarsAlloc);
    }
    p->pSeens = pcVar3;
    sVar7 = (long)p->nVarsAlloc << 2;
    if (p->pVarTypes == (int *)0x0) {
      piVar4 = (int *)malloc(sVar7);
    }
    else {
      piVar4 = (int *)realloc(p->pVarTypes,sVar7);
    }
    p->pVarTypes = piVar4;
    sVar7 = (long)p->nVarsAlloc << 3;
    if (p->pReasons == (Sto_Cls_t **)0x0) {
      ppSVar5 = (Sto_Cls_t **)malloc(sVar7);
    }
    else {
      ppSVar5 = (Sto_Cls_t **)realloc(p->pReasons,sVar7);
    }
    p->pReasons = ppSVar5;
    sVar7 = (long)p->nVarsAlloc << 4;
    if (p->pWatches == (Sto_Cls_t **)0x0) {
      ppSVar5 = (Sto_Cls_t **)malloc(sVar7);
    }
    else {
      ppSVar5 = (Sto_Cls_t **)realloc(p->pWatches,sVar7);
    }
    p->pWatches = ppSVar5;
    iVar1 = p->pCnf->nVars;
  }
  memset(p->pAssigns,0xff,(long)iVar1 << 2);
  memset(p->pSeens,0,(long)p->pCnf->nVars);
  memset(p->pVarTypes,0,(long)p->pCnf->nVars << 2);
  memset(p->pReasons,0,(long)p->pCnf->nVars << 3);
  memset(p->pWatches,0,(long)p->pCnf->nVars << 4);
  Inta_ManGlobalVars(p);
  iVar6 = p->nClosAlloc;
  iVar1 = p->pCnf->nClauses;
  if (iVar6 < iVar1) {
    if (iVar6 != 0) goto LAB_0070ea19;
    iVar6 = 1;
    while( true ) {
      p->nClosAlloc = iVar6;
LAB_0070ea19:
      if (iVar1 <= iVar6) break;
      iVar6 = iVar6 * 2;
    }
    if (p->pProofNums == (int *)0x0) {
      piVar4 = (int *)malloc((long)iVar6 << 2);
    }
    else {
      piVar4 = (int *)realloc(p->pProofNums,(long)iVar6 << 2);
      iVar1 = p->pCnf->nClauses;
    }
    p->pProofNums = piVar4;
  }
  else {
    piVar4 = p->pProofNums;
  }
  memset(piVar4,0,(long)iVar1 << 2);
  iVar6 = p->pCnf->nClauses;
  if (p->nIntersAlloc < iVar6) {
    p->nIntersAlloc = iVar6;
    if (p->pInters == (Aig_Obj_t **)0x0) {
      __s = (Aig_Obj_t **)malloc((long)iVar6 << 3);
    }
    else {
      __s = (Aig_Obj_t **)realloc(p->pInters,(long)iVar6 << 3);
      iVar6 = p->pCnf->nClauses;
    }
    p->pInters = __s;
  }
  else {
    __s = p->pInters;
  }
  memset(__s,0,(long)iVar6 << 3);
  return;
}

Assistant:

void Inta_ManResize( Inta_Man_t * p )
{
    p->Counter = 0;
    // check if resizing is needed
    if ( p->nVarsAlloc < p->pCnf->nVars )
    {
        // find the new size
        if ( p->nVarsAlloc == 0 )
            p->nVarsAlloc = 1;
        while ( p->nVarsAlloc < p->pCnf->nVars ) 
            p->nVarsAlloc *= 2;
        // resize the arrays
        p->pTrail    = ABC_REALLOC(lit,         p->pTrail,    p->nVarsAlloc );
        p->pAssigns  = ABC_REALLOC(lit,         p->pAssigns,  p->nVarsAlloc );
        p->pSeens    = ABC_REALLOC(char,        p->pSeens,    p->nVarsAlloc );
        p->pVarTypes = ABC_REALLOC(int,         p->pVarTypes, p->nVarsAlloc );
        p->pReasons  = ABC_REALLOC(Sto_Cls_t *, p->pReasons,  p->nVarsAlloc );
        p->pWatches  = ABC_REALLOC(Sto_Cls_t *, p->pWatches,  p->nVarsAlloc*2 );
    }

    // clean the free space
    memset( p->pAssigns , 0xff, sizeof(lit) * p->pCnf->nVars );
    memset( p->pSeens   , 0,    sizeof(char) * p->pCnf->nVars );
    memset( p->pVarTypes, 0,    sizeof(int) * p->pCnf->nVars );
    memset( p->pReasons , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars );
    memset( p->pWatches , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars*2 );

    // compute the number of common variables
    Inta_ManGlobalVars( p );

    // check if resizing of clauses is needed
    if ( p->nClosAlloc < p->pCnf->nClauses )
    {
        // find the new size
        if ( p->nClosAlloc == 0 )
            p->nClosAlloc = 1;
        while ( p->nClosAlloc < p->pCnf->nClauses ) 
            p->nClosAlloc *= 2;
        // resize the arrays
        p->pProofNums = ABC_REALLOC( int, p->pProofNums,  p->nClosAlloc );
    }
    memset( p->pProofNums, 0, sizeof(int) * p->pCnf->nClauses );

    // check if resizing of truth tables is needed
    if ( p->nIntersAlloc < p->pCnf->nClauses )
    {
        p->nIntersAlloc = p->pCnf->nClauses;
        p->pInters = ABC_REALLOC( Aig_Obj_t *, p->pInters, p->nIntersAlloc );
    }
    memset( p->pInters, 0, sizeof(Aig_Obj_t *) * p->pCnf->nClauses );
}